

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::coap::Message::GetRequestUri_abi_cxx11_
          (string *__return_storage_ptr__,Message *this)

{
  if (4 < (this->mHeader).mCode) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->mRequestUri);
    return __return_storage_ptr__;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp"
                ,0x507,"std::string ot::commissioner::coap::Message::GetRequestUri() const");
}

Assistant:

Coap::RequestHolder::RequestHolder(const RequestPtr &aRequest, ResponseHandler aHandler)
    : mRequest(aRequest)
    , mHandler(aHandler)
    , mRetransmissionCount(0)
    , mAcknowledged(false)
{
    uint32_t lowBound    = 1000 * kAckTimeout;
    uint32_t upperBound  = 1000 * kAckTimeout * kAckRandomFactorNumerator / kAckRandomFactorDenominator;
    uint32_t delay       = random::non_crypto::GetUint32InRange(lowBound, upperBound);
    mRetransmissionDelay = std::chrono::milliseconds(delay);
    mNextTimerShot       = Clock::now() + mRetransmissionDelay;
}